

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  string *psVar1;
  cmCustomCommandGenerator *this_local;
  
  psVar1 = cmCustomCommand::GetWorkingDirectory_abi_cxx11_(this->CC);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetWorkingDirectory() const
{
  return this->CC.GetWorkingDirectory();
}